

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::BasicReporter::Result(BasicReporter *this,AssertionResult *assertionResult)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OfType OVar2;
  pointer pcVar3;
  size_type sVar4;
  char cVar5;
  bool bVar6;
  ostream *poVar7;
  long lVar8;
  char *pcVar9;
  string local_68;
  size_t local_48;
  string local_40;
  
  if (((this->m_config).includeSuccessfulResults == false) &&
     ((assertionResult->m_resultData).resultType == Ok)) {
    return;
  }
  startSpansLazily(this);
  paVar1 = &local_68.field_2;
  pcVar3 = (assertionResult->m_info).lineInfo.file._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,
             pcVar3 + (assertionResult->m_info).lineInfo.file._M_string_length);
  sVar4 = local_68._M_string_length;
  local_48 = (assertionResult->m_info).lineInfo.line;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (sVar4 != 0) {
    poVar7 = (this->m_config).stream;
    pcVar3 = (assertionResult->m_info).lineInfo.file._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar3,
               pcVar3 + (assertionResult->m_info).lineInfo.file._M_string_length);
    local_48 = (assertionResult->m_info).lineInfo.line;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  sVar4 = (assertionResult->m_info).capturedExpression._M_string_length;
  if (sVar4 != 0) {
    poVar7 = (this->m_config).stream;
    pcVar3 = (assertionResult->m_info).capturedExpression._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,pcVar3,pcVar3 + sVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,local_68._M_dataplus._M_p,local_68._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    poVar7 = (this->m_config).stream;
    if (((assertionResult->m_resultData).resultType & FailureBit) == Ok) {
      pcVar9 = " succeeded";
      lVar8 = 10;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," failed",7);
      if ((((assertionResult->m_resultData).resultType & FailureBit) != Ok) &&
         (((assertionResult->m_info).resultDisposition & SuppressFail) == Normal))
      goto LAB_0012b7d8;
      poVar7 = (this->m_config).stream;
      pcVar9 = " - but was ok";
      lVar8 = 0xd;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,lVar8);
  }
LAB_0012b7d8:
  OVar2 = (assertionResult->m_resultData).resultType;
  if (OVar2 < ExplicitFailure) {
    if (OVar2 < Warning) {
      if ((uint)(OVar2 + Info) < 2) {
LAB_0012b870:
        if ((assertionResult->m_info).capturedExpression._M_string_length != 0) goto LAB_0012ba92;
        poVar7 = (this->m_config).stream;
        if ((OVar2 & FailureBit) == Ok) {
          pcVar9 = " succeeded";
          lVar8 = 10;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," failed",7);
          if ((((assertionResult->m_resultData).resultType & FailureBit) != Ok) &&
             (((assertionResult->m_info).resultDisposition & SuppressFail) == Normal))
          goto LAB_0012ba92;
          poVar7 = (this->m_config).stream;
          pcVar9 = " - but was ok";
          lVar8 = 0xd;
        }
LAB_0012ba8d:
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,lVar8);
        goto LAB_0012ba92;
      }
      if (OVar2 != Info) goto LAB_0012ba92;
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"info","");
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      pcVar3 = (assertionResult->m_resultData).message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar3,
                 pcVar3 + (assertionResult->m_resultData).message._M_string_length);
      streamVariableLengthText(this,&local_68,&local_40);
    }
    else {
      if ((uint)(OVar2 + 0xfffffff0) < 2) goto LAB_0012b870;
      if (OVar2 != Warning) goto LAB_0012ba92;
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"warning","");
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      pcVar3 = (assertionResult->m_resultData).message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar3,
                 pcVar3 + (assertionResult->m_resultData).message._M_string_length);
      streamVariableLengthText(this,&local_68,&local_40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else if (OVar2 < ThrewException) {
    if (OVar2 != ExplicitFailure) {
      if (OVar2 != Exception) goto LAB_0012ba92;
      goto LAB_0012b870;
    }
    poVar7 = (this->m_config).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"failed with message: \'",0x16);
    pcVar3 = (assertionResult->m_resultData).message._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar3,
               pcVar3 + (assertionResult->m_resultData).message._M_string_length);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
  }
  else {
    if (OVar2 == DidntThrowException) {
      poVar7 = (this->m_config).stream;
      if ((assertionResult->m_info).capturedExpression._M_string_length == 0) {
        pcVar9 = "No exception thrown where one was expected";
        lVar8 = 0x2a;
      }
      else {
        pcVar9 = " because no exception was thrown where one was expected";
        lVar8 = 0x37;
      }
      goto LAB_0012ba8d;
    }
    if (OVar2 != ThrewException) goto LAB_0012ba92;
    if ((assertionResult->m_info).capturedExpression._M_string_length == 0) {
      pcVar9 = "Unexpected";
      lVar8 = 10;
    }
    else {
      pcVar9 = " with unexpected";
      lVar8 = 0x10;
    }
    std::__ostream_insert<char,std::char_traits<char>>((this->m_config).stream,pcVar9,lVar8);
    poVar7 = (this->m_config).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," exception with message: \'",0x1a);
    pcVar3 = (assertionResult->m_resultData).message._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar3,
               pcVar3 + (assertionResult->m_resultData).message._M_string_length);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
LAB_0012ba92:
  bVar6 = AssertionResult::hasExpandedExpression(assertionResult);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((this->m_config).stream," for: ",6);
    pcVar3 = (assertionResult->m_resultData).reconstructedExpression._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar3,
               pcVar3 + (assertionResult->m_resultData).reconstructedExpression._M_string_length);
    sVar4 = local_68._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (0x28 < sVar4) {
      std::__ostream_insert<char,std::char_traits<char>>((this->m_config).stream,"\n",1);
      pcVar3 = (assertionResult->m_resultData).reconstructedExpression._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar3,
                 pcVar3 + (assertionResult->m_resultData).reconstructedExpression._M_string_length);
      sVar4 = local_68._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (sVar4 < 0x46) {
        std::__ostream_insert<char,std::char_traits<char>>((this->m_config).stream,"\t",1);
      }
    }
    poVar7 = (this->m_config).stream;
    pcVar3 = (assertionResult->m_resultData).reconstructedExpression._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar3,
               pcVar3 + (assertionResult->m_resultData).reconstructedExpression._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,local_68._M_dataplus._M_p,local_68._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  poVar7 = (this->m_config).stream;
  cVar5 = (char)poVar7;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  return;
}

Assistant:

virtual void Result( const AssertionResult& assertionResult ) {
            if( !m_config.includeSuccessfulResults && assertionResult.getResultType() == ResultWas::Ok )
                return;

            startSpansLazily();

            if( !assertionResult.getSourceInfo().empty() ) {
                TextColour colour( TextColour::FileName );
                m_config.stream << assertionResult.getSourceInfo();
            }

            if( assertionResult.hasExpression() ) {
                TextColour colour( TextColour::OriginalExpression );
                m_config.stream << assertionResult.getExpression();
                if( assertionResult.succeeded() ) {
                    TextColour successColour( TextColour::Success );
                    m_config.stream << " succeeded";
                }
                else {
                    TextColour errorColour( TextColour::Error );
                    m_config.stream << " failed";
                    if( assertionResult.isOk() ) {
                        TextColour okAnywayColour( TextColour::Success );
                        m_config.stream << " - but was ok";
                    }
                }
            }
            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    {
                        TextColour colour( TextColour::Error );
                        if( assertionResult.hasExpression() )
                            m_config.stream << " with unexpected";
                        else
                            m_config.stream << "Unexpected";
                        m_config.stream << " exception with message: '" << assertionResult.getMessage() << "'";
                    }
                    break;
                case ResultWas::DidntThrowException:
                    {
                        TextColour colour( TextColour::Error );
                        if( assertionResult.hasExpression() )
                            m_config.stream << " because no exception was thrown where one was expected";
                        else
                            m_config.stream << "No exception thrown where one was expected";
                    }
                    break;
                case ResultWas::Info:
                    {
                        TextColour colour( TextColour::ReconstructedExpression );
                        streamVariableLengthText( "info", assertionResult.getMessage() );
                    }
                    break;
                case ResultWas::Warning:
                    {
                        TextColour colour( TextColour::ReconstructedExpression );
                        streamVariableLengthText( "warning", assertionResult.getMessage() );
                    }
                    break;
                case ResultWas::ExplicitFailure:
                    {
                        TextColour colour( TextColour::Error );
                        m_config.stream << "failed with message: '" << assertionResult.getMessage() << "'";
                    }
                    break;
                case ResultWas::Unknown: // These cases are here to prevent compiler warnings
                case ResultWas::Ok:
                case ResultWas::FailureBit:
                case ResultWas::ExpressionFailed:
                case ResultWas::Exception:
                    if( !assertionResult.hasExpression() ) {
                        if( assertionResult.succeeded() ) {
                            TextColour colour( TextColour::Success );
                            m_config.stream << " succeeded";
                        }
                        else {
                            TextColour colour( TextColour::Error );
                            m_config.stream << " failed";
                            if( assertionResult.isOk() ) {
                                TextColour okAnywayColour( TextColour::Success );
                                m_config.stream << " - but was ok";
                            }
                        }
                    }
                    break;
            }

            if( assertionResult.hasExpandedExpression() ) {
                m_config.stream << " for: ";
                if( assertionResult.getExpandedExpression().size() > 40 ) {
                    m_config.stream << "\n";
                    if( assertionResult.getExpandedExpression().size() < 70 )
                        m_config.stream << "\t";
                }
                TextColour colour( TextColour::ReconstructedExpression );
                m_config.stream << assertionResult.getExpandedExpression();
            }
            m_config.stream << std::endl;
        }